

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O0

int __thiscall GenericAssemblerFile::open(GenericAssemblerFile *this,char *__file,int __oflag,...)

{
  Mode MVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  ulong uVar5;
  ulong extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  _Ios_Openmode local_3dc;
  _Ios_Openmode local_3cc;
  string local_388;
  string local_368;
  undefined1 local_348 [8];
  error_code ec;
  string local_318;
  undefined4 local_2f4;
  string local_2f0;
  undefined1 local_2d0 [8];
  ofstream temp;
  undefined1 local_c8 [7];
  bool exists;
  string local_a8;
  string local_88;
  string local_58;
  _Ios_Openmode local_38;
  _Ios_Openmode local_34;
  _Ios_Openmode flagsOverwrite;
  _Ios_Openmode flagsOpenExisting;
  error_code errorCode;
  bool onlyCheck_local;
  GenericAssemblerFile *this_local;
  
  errorCode._M_cat._7_1_ = (byte)__file & 1;
  std::error_code::error_code((error_code *)&flagsOverwrite);
  this->headerSize = this->originalHeaderSize;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->headerSize;
  this->virtualAddress = (int64_t)pbVar6;
  _Var4 = std::operator|(_S_in,_S_out);
  local_34 = std::operator|(_Var4,_S_bin);
  _Var4 = std::operator|(_S_out,_S_trunc);
  local_38 = std::operator|(_Var4,_S_bin);
  if ((errorCode._M_cat._7_1_ & 1) == 0) {
    MVar1 = this->mode;
    if (MVar1 == Open) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,local_34);
      uVar5 = std::ofstream::is_open();
      if ((uVar5 & 1) == 0) {
        ghc::filesystem::path::u8string_abi_cxx11_(&local_58,&this->fileName);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x2217f9,(char *)&local_58,pbVar6);
        uVar5 = std::__cxx11::string::~string((string *)&local_58);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
      goto LAB_0016e5ee;
    }
    if (MVar1 == Create) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,local_38);
      uVar5 = std::ofstream::is_open();
      if ((uVar5 & 1) == 0) {
        ghc::filesystem::path::u8string_abi_cxx11_(&local_88,&this->fileName);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x221810,(char *)&local_88,pbVar6);
        uVar5 = std::__cxx11::string::~string((string *)&local_88);
        this_local._7_1_ = 0;
      }
      else {
        this_local._7_1_ = 1;
      }
      goto LAB_0016e5ee;
    }
    if (MVar1 == Copy) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&flagsOverwrite;
      bVar3 = ghc::filesystem::copy_file
                        (&this->originalName,&this->fileName,overwrite_existing,(error_code *)pbVar6
                        );
      if (bVar3) {
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                  (&this->stream,(char *)&this->fileName,local_34);
        uVar5 = std::ofstream::is_open();
        if ((uVar5 & 1) == 0) {
          ghc::filesystem::path::u8string_abi_cxx11_((string *)local_c8,&this->fileName);
          Logger::printError<std::__cxx11::string>((Logger *)0x2,0x221810,(char *)local_c8,pbVar6);
          uVar5 = std::__cxx11::string::~string((string *)local_c8);
          this_local._7_1_ = 0;
        }
        else {
          this_local._7_1_ = 1;
        }
      }
      else {
        ghc::filesystem::path::u8string_abi_cxx11_(&local_a8,&this->originalName);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x221829,(char *)&local_a8,pbVar6);
        uVar5 = std::__cxx11::string::~string((string *)&local_a8);
        this_local._7_1_ = 0;
      }
      goto LAB_0016e5ee;
    }
  }
  temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_ = 0;
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0);
  MVar1 = this->mode;
  if (MVar1 == Open) {
    ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
              ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0,(char *)&this->fileName,
               local_34);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_2f0,&this->fileName);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x2217f9,(char *)&local_2f0,pbVar6);
      std::__cxx11::string::~string((string *)&local_2f0);
      this_local._7_1_ = 0;
    }
    else {
      std::ofstream::close();
      this_local._7_1_ = 1;
    }
  }
  else if (MVar1 == Create) {
    temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_ =
         ghc::filesystem::exists(&this->fileName);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)pbVar6 >> 8),
                      temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_);
    if ((bool)temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_) {
      local_3cc = local_34;
    }
    else {
      local_3cc = local_38;
    }
    ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
              ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0,(char *)&this->fileName,
               local_3cc);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_318,&this->fileName);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x221810,(char *)&local_318,pbVar6);
      std::__cxx11::string::~string((string *)&local_318);
      this_local._7_1_ = 0;
    }
    else {
      std::ofstream::close();
      if ((temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_ & 1) == 0) {
        ghc::filesystem::remove((filesystem *)&this->fileName,(char *)&flagsOverwrite);
      }
      this_local._7_1_ = 1;
    }
  }
  else if (MVar1 == Copy) {
    ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
              ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0,
               (char *)&this->originalName,local_34);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      ghc::filesystem::path::u8string_abi_cxx11_((string *)&ec._M_cat,&this->originalName);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x221829,(char *)&ec._M_cat,pbVar6);
      std::__cxx11::string::~string((string *)&ec._M_cat);
      this_local._7_1_ = 0;
    }
    else {
      std::ofstream::close();
      std::error_code::error_code((error_code *)local_348);
      bVar3 = ghc::filesystem::equivalent
                        (&this->originalName,&this->fileName,(error_code *)local_348);
      if (bVar3) {
        ghc::filesystem::path::u8string_abi_cxx11_(&local_368,&this->originalName);
        Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x221829,(char *)&local_368,pbVar6);
        std::__cxx11::string::~string((string *)&local_368);
        this_local._7_1_ = 0;
      }
      else {
        temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_ =
             ghc::filesystem::exists(&this->fileName);
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71((int7)((ulong)pbVar6 >> 8),
                          temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_);
        if ((bool)temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_) {
          local_3dc = local_34;
        }
        else {
          local_3dc = local_38;
        }
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                  ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0,
                   (char *)&this->fileName,local_3dc);
        bVar2 = std::ofstream::is_open();
        if ((bVar2 & 1) == 0) {
          ghc::filesystem::path::u8string_abi_cxx11_(&local_388,&this->fileName);
          Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x221810,(char *)&local_388,pbVar6)
          ;
          std::__cxx11::string::~string((string *)&local_388);
          this_local._7_1_ = 0;
        }
        else {
          std::ofstream::close();
          if ((temp.super_basic_ofstream<char,_std::char_traits<char>_>._511_1_ & 1) == 0) {
            ghc::filesystem::remove((filesystem *)&this->fileName,(char *)&flagsOverwrite);
          }
          this_local._7_1_ = 1;
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  local_2f4 = 1;
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream
            ((basic_ofstream<char,_std::char_traits<char>_> *)local_2d0);
  uVar5 = extraout_RAX;
LAB_0016e5ee:
  return (int)CONCAT71((int7)(uVar5 >> 8),this_local._7_1_);
}

Assistant:

bool GenericAssemblerFile::open(bool onlyCheck)
{
	std::error_code errorCode;

	headerSize = originalHeaderSize;
	virtualAddress = headerSize;

	auto flagsOpenExisting = fs::ofstream::in | fs::ofstream::out | fs::ofstream::binary;
	auto flagsOverwrite = fs::ofstream::out | fs::ofstream::trunc | fs::ofstream::binary;

	if (!onlyCheck)
	{
		// actually open the file
		switch (mode)
		{
		case Open:
			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not open file %s",fileName.u8string());
				return false;
			}
			return true;

		case Create:
			stream.open(fileName, flagsOverwrite);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;

		case Copy:
			if (!fs::copy_file(originalName, fileName, fs::copy_options::overwrite_existing, errorCode))
			{
				Logger::printError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
				return false;
			}

			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;
		}
	}

	// else only check if it can be done, don't actually do it permanently
	bool exists = false;
	fs::ofstream temp;
	switch (mode)
	{
	case Open:
		temp.open(fileName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not open file %s",fileName.u8string());
			return false;
		}
		temp.close();
		return true;

	case Create:
		// open file with writee access. if it didn't exist before, remove it afterwards
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);

		return true;

	case Copy:
		// check original file
		temp.open(originalName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
			return false;
		}
		temp.close();

		// Check input and output are not the same
		std::error_code ec;
		if (fs::equivalent(originalName, fileName, ec))
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s", originalName.u8string());
			return false;
		}

		// check new file, same as create
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);
		return true;
	}

	return false;
}